

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall Graph::calc_node_distance(Graph *this)

{
  uint uVar1;
  Node *pNVar2;
  double **ppdVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  uVar1 = this->num_node;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  lVar6 = 1;
  lVar7 = 0x24;
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    pNVar2 = this->nodes;
    ppdVar3 = this->distance_matrix;
    piVar8 = (int *)((long)&pNVar2->x + lVar7);
    for (lVar9 = lVar6; (int)lVar9 < (int)uVar1; lVar9 = lVar9 + 1) {
      dVar10 = (double)(pNVar2[uVar4].x - piVar8[-1]);
      dVar11 = (double)(pNVar2[uVar4].y - *piVar8);
      dVar10 = SQRT(dVar11 * dVar11 + dVar10 * dVar10);
      ppdVar3[lVar9][uVar4] = dVar10;
      ppdVar3[uVar4][lVar9] = dVar10;
      piVar8 = piVar8 + 8;
    }
    lVar6 = lVar6 + 1;
    lVar7 = lVar7 + 0x20;
  }
  return;
}

Assistant:

void Graph::calc_node_distance()
{
	for(int i = 0; i < num_node; i++){
		for(int j = i + 1; j < num_node; j++){
			distance_matrix[i][j] = distance_matrix[j][i] = sqrt(pow(nodes[i].x - nodes[j].x, 2) + pow(nodes[i].y - nodes[j].y, 2));
		}
	}
}